

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O2

base_learner * multilabel_oaa_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<multi_oaa,_example> *plVar2;
  long lVar3;
  undefined **ppuVar4;
  label_parser *plVar5;
  byte bVar6;
  allocator local_202;
  allocator local_201;
  free_ptr<multi_oaa> data;
  string local_1f0 [32];
  string local_1d0;
  string local_1b0;
  option_group_definition new_options;
  undefined1 local_158 [112];
  bool local_e8;
  typed_option<unsigned_long> local_b8;
  
  bVar6 = 0;
  scoped_calloc_or_throw<multi_oaa>();
  std::__cxx11::string::string
            ((string *)&local_1b0,"Multilabel One Against All",(allocator *)local_158);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"multilabel_oaa",&local_201);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_158,&local_1d0,
             &(data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl)->k);
  local_e8 = true;
  std::__cxx11::string::string(local_1f0,"One-against-all multilabel with <k> labels",&local_202);
  std::__cxx11::string::_M_assign((string *)(local_158 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_b8,(typed_option<unsigned_long> *)local_158);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_b8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_1f0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_158);
  std::__cxx11::string::~string((string *)&local_1d0);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_158,"multilabel_oaa",(allocator *)local_1f0);
  iVar1 = (*options->_vptr_options_i[1])(options,local_158);
  std::__cxx11::string::~string((string *)local_158);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<multi_oaa,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<multi_oaa,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl,base,
                        predict_or_learn<true>,predict_or_learn<false>,
                        (data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl)->k,multilabels);
    data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_multi_oaa_*,_false>.
    _M_head_impl = (multi_oaa *)0x0;
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = finish_example;
    ppuVar4 = &MULTILABEL::multilabel;
    plVar5 = &all->p->lp;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      plVar5->default_label = (_func_void_void_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      plVar5 = (label_parser *)((long)plVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    all->label_type = multi;
    all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002abde0;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<multi_oaa,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* multilabel_oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<multi_oaa>();
  option_group_definition new_options("Multilabel One Against All");
  new_options.add(make_option("multilabel_oaa", data->k).keep().help("One-against-all multilabel with <k> labels"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multilabel_oaa"))
    return nullptr;

  LEARNER::learner<multi_oaa, example>& l = LEARNER::init_learner(data, as_singleline(setup_base(options, all)),
      predict_or_learn<true>, predict_or_learn<false>, data->k, prediction_type::multilabels);
  l.set_finish_example(finish_example);
  all.p->lp = MULTILABEL::multilabel;
  all.label_type = label_type::multi;
  all.delete_prediction = MULTILABEL::multilabel.delete_label;

  return make_base(l);
}